

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPRequest::getp_getCookies
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  TadsHttpRequestHeader *pTVar1;
  int iVar2;
  vm_obj_id_t obj;
  vm_httpreq_ext *pvVar3;
  char *pcVar4;
  vm_val_t *in_RDX;
  CVmObjHTTPRequest *in_RDI;
  bool bVar5;
  size_t vallen;
  char *val;
  size_t namelen;
  char *name;
  char *p;
  CVmObjLookupTable *tab;
  TadsHttpRequestHeader *hdrs;
  TadsHttpRequest *req;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  vm_val_t *in_stack_ffffffffffffff78;
  vm_val_t *this_00;
  char *pcVar6;
  CVmObjLookupTable *keylen;
  CVmObjLookupTable *tab_00;
  CVmObjLookupTable *local_58;
  TadsHttpRequestHeader *local_48;
  
  if ((getp_getCookies(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_getCookies(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getCookies::desc,0);
    __cxa_guard_release(&getp_getCookies(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff78,
                     (uint *)CONCAT17(in_stack_ffffffffffffff77,
                                      CONCAT16(in_stack_ffffffffffffff76,
                                               CONCAT15(in_stack_ffffffffffffff75,
                                                        CONCAT14(in_stack_ffffffffffffff74,
                                                                 in_stack_ffffffffffffff70)))),
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (iVar2 == 0) {
    pvVar3 = get_ext(in_RDI);
    pTVar1 = pvVar3->req->hdr_list;
    this_00 = in_RDX;
    obj = CVmObjLookupTable::create
                    (CONCAT13(in_stack_ffffffffffffff77,
                              CONCAT12(in_stack_ffffffffffffff76,
                                       CONCAT11(in_stack_ffffffffffffff75,in_stack_ffffffffffffff74)
                                      )),in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    vm_val_t::set_obj(this_00,obj);
    CVmStack::push(in_RDX);
    vm_objp(0);
    for (local_48 = pTVar1->nxt; local_48 != (TadsHttpRequestHeader *)0x0; local_48 = local_48->nxt)
    {
      iVar2 = stricmp((char *)CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                      (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if (iVar2 == 0) {
        local_58 = (CVmObjLookupTable *)local_48->value;
        while (*(char *)&(local_58->super_CVmObjCollection).super_CVmObject._vptr_CVmObject != '\0')
        {
          while (iVar2 = isspace((int)*(char *)&(local_58->super_CVmObjCollection).super_CVmObject.
                                                _vptr_CVmObject), tab_00 = local_58, iVar2 != 0) {
            local_58 = (CVmObjLookupTable *)
                       ((long)&(local_58->super_CVmObjCollection).super_CVmObject._vptr_CVmObject +
                       1);
          }
          while( true ) {
            bVar5 = false;
            if (*(char *)&(local_58->super_CVmObjCollection).super_CVmObject._vptr_CVmObject != '\0'
               ) {
              pcVar4 = strchr("=;,",(int)*(char *)&(local_58->super_CVmObjCollection).
                                                   super_CVmObject._vptr_CVmObject);
              bVar5 = pcVar4 == (char *)0x0;
            }
            if (!bVar5) break;
            local_58 = (CVmObjLookupTable *)
                       ((long)&(local_58->super_CVmObjCollection).super_CVmObject._vptr_CVmObject +
                       1);
          }
          pcVar4 = (char *)((long)local_58 - (long)tab_00);
          keylen = (CVmObjLookupTable *)0x3a9505;
          pcVar6 = (char *)0x0;
          in_stack_ffffffffffffff77 = 0;
          if (*(char *)&(local_58->super_CVmObjCollection).super_CVmObject._vptr_CVmObject == '=') {
            keylen = (CVmObjLookupTable *)
                     ((long)&(local_58->super_CVmObjCollection).super_CVmObject._vptr_CVmObject + 1)
            ;
            local_58 = keylen;
            while( true ) {
              bVar5 = false;
              if (*(char *)&(local_58->super_CVmObjCollection).super_CVmObject._vptr_CVmObject !=
                  '\0') {
                pcVar6 = strchr(" \t;,",(int)*(char *)&(local_58->super_CVmObjCollection).
                                                       super_CVmObject._vptr_CVmObject);
                bVar5 = pcVar6 == (char *)0x0;
              }
              if (!bVar5) break;
              local_58 = (CVmObjLookupTable *)
                         ((long)&(local_58->super_CVmObjCollection).super_CVmObject._vptr_CVmObject
                         + 1);
            }
            pcVar6 = (char *)((long)local_58 - (long)keylen);
            in_stack_ffffffffffffff76 = 0;
          }
          add_parsed_val(tab_00,pcVar4,(size_t)keylen,pcVar6,(size_t)in_RDI,
                         (int)((ulong)this_00 >> 0x20));
          while( true ) {
            bVar5 = false;
            if (*(char *)&(local_58->super_CVmObjCollection).super_CVmObject._vptr_CVmObject != '\0'
               ) {
              pcVar4 = strchr(" \t;,",(int)*(char *)&(local_58->super_CVmObjCollection).
                                                     super_CVmObject._vptr_CVmObject);
              bVar5 = pcVar4 != (char *)0x0;
            }
            if (!bVar5) break;
            local_58 = (CVmObjLookupTable *)
                       ((long)&(local_58->super_CVmObjCollection).super_CVmObject._vptr_CVmObject +
                       1);
          }
          in_stack_ffffffffffffff75 = 0;
        }
      }
    }
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getCookies(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;

    /* create a lookup table to hold the result; push it for gc protection */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 32, 64));
    G_stk->push(retval);
    CVmObjLookupTable *tab =
        (CVmObjLookupTable *)vm_objp(vmg_ retval->val.obj);

    /* scan for "Cookie" headers */
    for (hdrs = hdrs->nxt ; hdrs != 0 ; hdrs = hdrs->nxt)
    {
        /* if this is a Cookie: header, process it */
        if (stricmp(hdrs->name, "cookie") == 0)
        {
            /* scan the list of cookie name=value pairs */
            for (const char *p = hdrs->value ; *p != '\0' ; )
            {
                /* skip leading whitespace */
                for ( ; isspace(*p) ; ++p) ;

                /* the cookie name ends at the '=', ';', ',', or null */
                const char *name = p;
                for ( ; *p != '\0' && strchr("=;,", *p) == 0 ; ++p) ;
                size_t namelen = p - name;

                /* if we found the '=', scan the value */
                const char *val = "";
                size_t vallen = 0;
                if (*p == '=')
                {
                    /* skip the '=' and scan for the end of the cookie */
                    for (val = ++p ; *p != '\0' && strchr(" \t;,", *p) == 0 ;
                         ++p) ;
                    vallen = p - val;
                }

                /* add this cookie to the table */
                add_parsed_val(vmg_ tab, name, namelen, val, vallen,
                               ENCMODE_NONE);

                /* scan ahead to the next non-delimiter */
                for ( ; *p != '\0' && strchr(" \t;,", *p) != 0 ; ++p) ;
            }
        }
    }

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}